

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

int linenoiseEditInsert(linenoiseState *l,char *cbuf,int clen)

{
  size_t sVar1;
  size_t sVar2;
  ssize_t sVar3;
  size_t __n;
  size_t __n_00;
  char *__src;
  
  sVar1 = l->len;
  __n_00 = (size_t)clen;
  if (sVar1 + __n_00 <= l->buflen) {
    __n = sVar1 - l->pos;
    if (__n == 0) {
      memcpy(l->buf + sVar1,cbuf,__n_00);
      l->pos = l->pos + __n_00;
      sVar1 = l->len + __n_00;
      l->len = sVar1;
      l->buf[sVar1] = '\0';
      if (mlmode == 0) {
        sVar1 = promptTextColumnLen(l->prompt,l->plen);
        sVar2 = columnPos(l->buf,l->len,l->len);
        if ((sVar2 + sVar1 < l->cols) && (hintsCallback == (linenoiseHintsCallback *)0x0)) {
          if (maskmode == '\x01') {
            cbuf = "*\x1b[H\x1b[2J";
            __n_00 = 1;
          }
          sVar3 = write(l->ofd,cbuf,__n_00);
          if (sVar3 != -1) {
            return 0;
          }
          return -1;
        }
      }
    }
    else {
      __src = l->buf + l->pos;
      memmove(__src + __n_00,__src,__n);
      memcpy(l->buf + l->pos,cbuf,__n_00);
      l->pos = l->pos + __n_00;
      sVar1 = __n_00 + l->len;
      l->len = sVar1;
      l->buf[sVar1] = '\0';
    }
    refreshLine(l);
  }
  return 0;
}

Assistant:

int linenoiseEditInsert(struct linenoiseState *l, const char *cbuf, int clen) {
    if (l->len+clen <= l->buflen) {
        if (l->len == l->pos) {
            memcpy(&l->buf[l->pos],cbuf,clen);
            l->pos+=clen;
            l->len+=clen;;
            l->buf[l->len] = '\0';
            if ((!mlmode && promptTextColumnLen(l->prompt,l->plen)+columnPos(l->buf,l->len,l->len) < l->cols && !hintsCallback)) {
                /* Avoid a full update of the line in the
                 * trivial case. */
                if (maskmode == 1) {
                  static const char d = '*';
                  if (write(l->ofd,&d,1) == -1) return -1;
                } else {
                  if (write(l->ofd,cbuf,clen) == -1) return -1;
                }
            } else {
                refreshLine(l);
            }
        } else {
            memmove(l->buf+l->pos+clen,l->buf+l->pos,l->len-l->pos);
            memcpy(&l->buf[l->pos],cbuf,clen);
            l->pos+=clen;
            l->len+=clen;
            l->buf[l->len] = '\0';
            refreshLine(l);
        }
    }
    return 0;
}